

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_AES.cpp
# Opt level: O1

AESDecContext * __thiscall ASDCP::AESDecContext::InitKey(AESDecContext *this,byte_t *key)

{
  undefined8 uVar1;
  int iVar2;
  ILogSink *this_00;
  AES_KEY *key_00;
  undefined8 *in_RDX;
  undefined1 *puVar3;
  
  if (in_RDX == (undefined8 *)0x0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"NULL pointer in file %s, line %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_AES.cpp"
               ,0xb1);
    puVar3 = Kumu::RESULT_PTR;
  }
  else if (*(long *)key == 0) {
    key_00 = (AES_KEY *)operator_new(0x128);
    key_00[1].rd_key[3] = 0;
    key_00[1].rd_key[4] = 0;
    key_00[1].rd_key[5] = 0;
    key_00[1].rd_key[6] = 0;
    *(undefined1 *)(key_00[1].rd_key + 7) = 0;
    *(undefined ***)(key_00[1].rd_key + 1) = &PTR__SymmetricKey_00228828;
    *(AES_KEY **)key = key_00;
    *(undefined1 *)(key_00[1].rd_key + 3) = 1;
    uVar1 = in_RDX[1];
    *(undefined8 *)((long)key_00[1].rd_key + 0xd) = *in_RDX;
    *(undefined8 *)((long)key_00[1].rd_key + 0x15) = uVar1;
    iVar2 = AES_set_decrypt_key((uchar *)((long)key_00[1].rd_key + 0xd),0x80,key_00);
    if (iVar2 == 0) {
      puVar3 = Kumu::RESULT_OK;
    }
    else {
      print_ssl_error();
      puVar3 = ASDCP::RESULT_CRYPT_INIT;
    }
  }
  else {
    puVar3 = Kumu::RESULT_INIT;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::AESDecContext::InitKey(const byte_t* key)
{
  KM_TEST_NULL_L(key);

  if ( m_Context )
    return  RESULT_INIT;

  m_Context = new h__AESContext;
  m_Context->m_KeyBuf.Set(key);

  if ( AES_set_decrypt_key(m_Context->m_KeyBuf.Value(), KEY_SIZE_BITS, m_Context) )
    {
      print_ssl_error();
      return RESULT_CRYPT_INIT;
    }

  return RESULT_OK;
}